

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O3

void * threadsafe_mem_leak_operator_new(size_t size)

{
  MemoryLeakDetector *pMVar1;
  SimpleMutex *mtx;
  TestMemoryAllocator *allocator;
  char *pcVar2;
  undefined8 *puVar3;
  MemLeakScopedMutex lock;
  ScopedMutexLock SStack_18;
  
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  mtx = MemoryLeakDetector::getMutex(pMVar1);
  ScopedMutexLock::ScopedMutexLock(&SStack_18,mtx);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  allocator = getCurrentNewAllocator();
  pcVar2 = MemoryLeakDetector::allocMemory(pMVar1,allocator,size,false);
  if (pcVar2 != (char *)0x0) {
    ScopedMutexLock::~ScopedMutexLock(&SStack_18);
    return pcVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &std::__cxx11::istringstream::VTT;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

UT_THROW(std::bad_alloc)
{
    MemLeakScopedMutex lock;
    void* memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewAllocator(), size);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}